

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O2

record * __thiscall record::operator=(record *this,record *r)

{
  byte bVar1;
  int32_t *piVar2;
  int32_t *piVar3;
  int i;
  ulong uVar4;
  
  if (this != r) {
    ~record(this);
    this->recordID = r->recordID;
    bVar1 = r->numFields;
    this->numFields = bVar1;
    piVar3 = (int32_t *)operator_new__((ulong)bVar1 << 2);
    this->fields = piVar3;
    piVar2 = r->fields;
    for (uVar4 = 0; bVar1 != uVar4; uVar4 = uVar4 + 1) {
      piVar3[uVar4] = piVar2[uVar4];
    }
  }
  return this;
}

Assistant:

record &record::operator=(const record &r) {
    if(this != &r) {
        this->~record();

        recordID = r.recordID;
        numFields = r.numFields;

        fields = new int32_t[numFields];

        for (int i = 0; i < numFields; ++i) {
            fields[i] = r.fields[i];
        }
    }
    return *this;
}